

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O2

void __thiscall BaseComponent::BaseComponent(BaseComponent *this)

{
  BaseStoppable::BaseStoppable(&this->super_BaseStoppable);
  (this->super_BaseStoppable).super_BaseThread._vptr_BaseThread = (_func_int **)&PTR_Run_00109bf0;
  std::queue<Event*,std::deque<Event*,std::allocator<Event*>>>::
  queue<std::deque<Event*,std::allocator<Event*>>,void>(&this->queue);
  *(undefined8 *)((long)&(this->queueLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queueLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queueLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queueLock).super___mutex_base._M_mutex + 8) = 0;
  (this->queueLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

BaseComponent::BaseComponent() :
    BaseStoppable() {}